

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFill.cpp
# Opt level: O2

void __thiscall CDirectiveFill::Encode(CDirectiveFill *this)

{
  size_t in_RCX;
  void *__n;
  void *__buf;
  uchar ByteBuffer [128];
  undefined1 auStack_98 [128];
  
  __buf = (void *)this->Size;
  __n = (void *)0x80;
  if (__buf < (void *)0x80) {
    __n = __buf;
  }
  memset(auStack_98,this->Byte,(size_t)__n);
  while( true ) {
    if (__buf < (void *)0x81) break;
    FileManager::write(g_fileManager,(int)auStack_98,(void *)0x80,in_RCX);
    __buf = (void *)((long)__buf + -0x80);
  }
  FileManager::write(g_fileManager,(int)auStack_98,__buf,in_RCX);
  return;
}

Assistant:

void CDirectiveFill::Encode()
{
	unsigned char ByteBuffer[128];

	memset(ByteBuffer,Byte,Size > 128 ? 128 : Size);
	size_t n = Size;
	while (n > 128)
	{
		g_fileManager->write(ByteBuffer,128);
		n -= 128;
	}
	g_fileManager->write(ByteBuffer,n);
}